

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

reference andres::marray_detail::AccessOperatorHelper<false>::
          execute<int,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,true,std::allocator<unsigned_long>>
                    (View<int,_true,_std::allocator<unsigned_long>_> *v,
                    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    it)

{
  size_t sVar1;
  bool assertion;
  size_t offset;
  size_t local_20;
  
  View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(v);
  Assert<bool>(v->data_ != (pointer)0x0);
  sVar1 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(v);
  assertion = true;
  if (sVar1 == 0) {
    assertion = *it._M_current == 0;
  }
  Assert<bool>(assertion);
  View<int,true,std::allocator<unsigned_long>>::
  coordinatesToOffset<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)v,it,&local_20);
  return v->data_ + local_20;
}

Assistant:

static typename View<T, isConst, A>::reference
    execute(const View<T, isConst, A>& v, U it)
    {
        v.testInvariant();
        Assert(MARRAY_NO_DEBUG || v.data_ != 0);
        Assert(MARRAY_NO_DEBUG || v.dimension() != 0 || *it == 0);
        std::size_t offset;
        v.coordinatesToOffset(it, offset);
        return v.data_[offset];
    }